

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::AtomicCounterCase::AtomicCounterCase
          (AtomicCounterCase *this,Context *context,char *name,char *description,IVec3 *localSize,
          IVec3 *workSize)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,"Basic atomic counter test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02167260;
  lVar1 = 0;
  do {
    (this->m_localSize).m_data[lVar1] = *(int *)(description + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->m_workSize).m_data[lVar1] = localSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

AtomicCounterCase (Context& context, const char* name, const char* description, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
	}